

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
pbrt::Tokenizer::Tokenizer
          (Tokenizer *this,void *ptr,size_t len,string *filename,
          function<void_(const_char_*,_const_pbrt::FileLoc_*)> *errorCallback)

{
  pointer pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  string *psVar4;
  
  (this->loc).filename._M_len = 0;
  (this->loc).filename._M_str = (char *)0x0;
  (this->loc).line = 1;
  *(undefined8 *)&(this->loc).column = 0;
  *(undefined8 *)((long)&(this->errorCallback).super__Function_base._M_functor + 4) = 0;
  *(undefined8 *)((long)&(this->errorCallback).super__Function_base._M_functor + 8) = 0;
  (this->errorCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->errorCallback)._M_invoker = errorCallback->_M_invoker;
  if ((errorCallback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(errorCallback->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->errorCallback).super__Function_base._M_functor =
         *(undefined8 *)&(errorCallback->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->errorCallback).super__Function_base._M_functor + 8) = uVar3;
    (this->errorCallback).super__Function_base._M_manager =
         (errorCallback->super__Function_base)._M_manager;
    (errorCallback->super__Function_base)._M_manager = (_Manager_type)0x0;
    errorCallback->_M_invoker = (_Invoker_type)0x0;
  }
  this->unmapPtr = ptr;
  this->unmapLength = len;
  (this->contents)._M_dataplus._M_p = (pointer)&(this->contents).field_2;
  (this->contents)._M_string_length = 0;
  (this->contents).field_2._M_local_buf[0] = '\0';
  (this->sEscaped)._M_dataplus._M_p = (pointer)&(this->sEscaped).field_2;
  (this->sEscaped)._M_string_length = 0;
  (this->sEscaped).field_2._M_local_buf[0] = '\0';
  psVar4 = (string *)operator_new(0x20);
  *(string **)psVar4 = psVar4 + 0x10;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>(psVar4,pcVar1,pcVar1 + filename->_M_string_length);
  pcVar2 = *(char **)psVar4;
  (this->loc).filename._M_len = *(size_t *)(psVar4 + 8);
  (this->loc).filename._M_str = pcVar2;
  (this->loc).line = 1;
  (this->loc).column = 0;
  this->pos = (char *)ptr;
  this->end = (char *)(len + (long)ptr);
  return;
}

Assistant:

Tokenizer::Tokenizer(void *ptr, size_t len, std::string filename,
                     std::function<void(const char *, const FileLoc *)> errorCallback)
    : errorCallback(std::move(errorCallback)), unmapPtr(ptr), unmapLength(len) {
    // This is disgusting and leaks memory, but it ensures that the
    // filename in FileLocs returned by the Tokenizer remain valid even
    // after it has been destroyed.
    loc = FileLoc(*new std::string(filename));
    pos = (const char *)ptr;
    end = pos + len;
}